

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::ScriptElement::GetData(ByteData *__return_storage_ptr__,ScriptElement *this)

{
  ScriptElementType SVar1;
  ByteData *this_00;
  value_type local_a5;
  ScriptType local_a4;
  undefined1 local_a0 [4];
  ScriptType op_code;
  undefined1 local_88 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_array;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  ScriptElement *this_local;
  
  this_00 = __return_storage_ptr__;
  byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3fcdc8);
  SVar1 = this->type_;
  if (SVar1 != kElementOpCode) {
    if (SVar1 == kElementBinary) {
      ByteData::GetBytes(&local_60,&this->binary_data_);
      WallyUtil::CreateScriptDataFromBytes(&local_48,&local_60,0);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this_00->data_,&__return_storage_ptr__->data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this_00->data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this_00->data_);
      goto LAB_003fcf31;
    }
    if (SVar1 == kElementNumber) {
      SerializeScriptNum((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,
                         this->value_);
      WallyUtil::CreateScriptDataFromBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88,0);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this_00->data_,&__return_storage_ptr__->data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this_00->data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this_00->data_);
      goto LAB_003fcf31;
    }
  }
  local_a4 = ScriptOperator::GetDataType(&this->op_code_);
  if (local_a4 != kOpInvalidOpCode) {
    local_a5 = (undefined1)local_a4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,&local_a5);
  }
LAB_003fcf31:
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this_00->data_);
  return this_00;
}

Assistant:

ByteData ScriptElement::GetData() const {
  std::vector<uint8_t> byte_data;
  switch (type_) {
    case kElementBinary: {
      byte_data =
          WallyUtil::CreateScriptDataFromBytes(binary_data_.GetBytes());
      break;
    }
    case kElementNumber: {
      std::vector<uint8_t> byte_array = SerializeScriptNum(value_);
      byte_data = WallyUtil::CreateScriptDataFromBytes(byte_array);
      break;
    }
    case kElementOpCode:
    default: {
      ScriptType op_code = op_code_.GetDataType();
      if (op_code != kOpInvalidOpCode) {
        byte_data.push_back(static_cast<uint8_t>(op_code));
      }
      break;
    }
  }
  return ByteData(byte_data);
}